

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void bench_get_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,float *GW,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  size_type sVar1;
  reference pvVar2;
  reference __src;
  vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
  *in_RDI;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *in_R8;
  interest_point ipoint;
  int i;
  int _b;
  int _a;
  int counter;
  int j;
  ulong in_stack_fffffffffffffe48;
  reference in_stack_fffffffffffffe50;
  int local_164;
  undefined1 local_154 [52];
  benchmark_data *in_stack_fffffffffffffee0;
  float *in_stack_fffffffffffffee8;
  interest_point *in_stack_fffffffffffffef0;
  integral_image *in_stack_fffffffffffffef8;
  _func_void_integral_image_ptr_interest_point_ptr_float_ptr *in_stack_ffffffffffffff00;
  int local_40;
  int local_2c;
  
  for (local_2c = 0;
      sVar1 = std::
              vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
              ::size(in_RDI), (ulong)(long)local_2c < sVar1; local_2c = local_2c + 1) {
    pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                       (in_R8,(long)local_2c);
    local_164 = *(int *)(pvVar2 + 0x208);
    if (5 < local_164) {
      local_164 = 5;
    }
    for (local_40 = 0; local_40 < local_164; local_40 = local_40 + 1) {
      __src = std::vector<interest_point,_std::allocator<interest_point>_>::at
                        ((vector<interest_point,_std::allocator<interest_point>_> *)
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      memcpy(local_154,__src,0x114);
      std::
      vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
      ::operator[](in_RDI,(long)local_2c);
      std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[](in_R8,(long)local_2c)
      ;
      perf_get_descriptor(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                          in_stack_fffffffffffffee0);
    }
    if (local_164 != 0) {
      in_stack_fffffffffffffe48 = (ulong)local_164;
      in_stack_fffffffffffffe50 =
           std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                     (in_R8,(long)local_2c);
      *(ulong *)(in_stack_fffffffffffffe50 + 0x218) =
           *(ulong *)(in_stack_fffffffffffffe50 + 0x218) / in_stack_fffffffffffffe48;
      pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                         (in_R8,(long)local_2c);
      *(ulong *)(pvVar2 + 0x228) = *(ulong *)(pvVar2 + 0x228) / (ulong)(long)local_164;
      pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                         (in_R8,(long)local_2c);
      *(ulong *)(pvVar2 + 0x220) = *(ulong *)(pvVar2 + 0x220) / (ulong)(long)local_164;
      pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                         (in_R8,(long)local_2c);
      *(double *)(pvVar2 + 0x230) = *(double *)(pvVar2 + 0x230) / (double)local_164;
    }
  }
  return;
}

Assistant:

void bench_get_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *, float *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points, float *GW,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_descriptor(functions[j], iimage, &ipoint, GW, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}